

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool __thiscall
google::protobuf::MergedDescriptorDatabase::FindFileByName
          (MergedDescriptorDatabase *this,string *filename,FileDescriptorProto *output)

{
  pointer ppDVar1;
  pointer ppDVar2;
  int iVar3;
  
  ppDVar1 = (this->sources_).
            super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppDVar2 = (this->sources_).
            super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppDVar2 == ppDVar1) {
      return false;
    }
    iVar3 = (*(*ppDVar2)->_vptr_DescriptorDatabase[2])(*ppDVar2,filename,output);
    ppDVar2 = (pointer)((long)ppDVar2 + 8);
  } while ((char)iVar3 == '\0');
  return (bool)(char)iVar3;
}

Assistant:

bool MergedDescriptorDatabase::FindAllFileNames(
    std::vector<std::string>* output) {
  bool implemented = false;
  for (DescriptorDatabase* source : sources_) {
    std::vector<std::string> source_output;
    if (source->FindAllFileNames(&source_output)) {
      output->reserve(output->size() + source_output.size());
      for (auto& source_out : source_output) {
        output->push_back(std::move(source_out));
      }
      implemented = true;
    }
  }
  return implemented;
}